

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O2

vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
* ColorTracker::getContours
            (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *__return_storage_ptr__,Mat *mask)

{
  ProcessingException *this;
  allocator local_162;
  allocator local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined8 local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((*(ushort *)mask & 0xff8) == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_140.field_2._M_allocated_capacity = 0;
    local_160.field_2._M_allocated_capacity = 0;
    local_140._M_dataplus._M_p._0_4_ = 0x1010000;
    local_160._M_dataplus._M_p._0_4_ = 0x8204000c;
    local_120 = 0;
    local_160._M_string_length = (size_type)__return_storage_ptr__;
    local_140._M_string_length = (size_type)mask;
    cv::findContours(&local_140,&local_160,0,3);
    return __return_storage_ptr__;
  }
  this = (ProcessingException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,&local_161);
  std::operator+(&local_b8,"in ",&local_d8);
  std::operator+(&local_98,&local_b8,", at Line ");
  std::__cxx11::to_string(&local_f8,0xf2);
  std::operator+(&local_78,&local_98,&local_f8);
  std::operator+(&local_58,&local_78,", ");
  std::__cxx11::string::string((string *)&local_118,"getContours",&local_162);
  std::operator+(&local_38,&local_58,&local_118);
  std::operator+(&local_160,&local_38,"(): ");
  std::operator+(&local_140,&local_160,"invalid input: passed image must have 1 channel");
  ProcessingException::ProcessingException(this,&local_140);
  __cxa_throw(this,&ProcessingException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

vector<vector<Point>> ColorTracker::getContours(const Mat& mask) noexcept(false){
    if(mask.channels()!=1){
        //cout << "invalid input" << endl;
        throw ProcessingException(WHERE + "invalid input: passed image must have 1 channel");
    }
    vector<vector<Point>> contours;

    cv::findContours(mask,contours,cv::RETR_EXTERNAL,cv::CHAIN_APPROX_TC89_L1);

    return contours;
}